

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O3

void __thiscall
ConfidentialValue_Constractor_hex_err_Test::TestBody
          (ConfidentialValue_Constractor_hex_err_Test *this)

{
  bool bVar1;
  ConfidentialValue value;
  string local_60;
  ConfidentialValue local_40;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"001122","");
    cfd::core::ConfidentialValue::ConfidentialValue(&local_40,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    local_40._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
    if (local_40.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  testing::Message::Message((Message *)&local_40);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_60,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
             ,0x5f,
             "Expected: ConfidentialValue value(\"001122\") throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_40);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
  if (local_40._vptr_ConfidentialValue != (_func_int **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && (local_40._vptr_ConfidentialValue != (_func_int **)0x0)) {
      (**(code **)(*local_40._vptr_ConfidentialValue + 8))();
    }
  }
  return;
}

Assistant:

TEST(ConfidentialValue, Constractor_hex_err) {
  // error
  EXPECT_THROW(ConfidentialValue value("001122"), CfdException);
}